

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_refine_qualities.cpp
# Opt level: O3

void __thiscall
Omega_h::MetricRefineQualities<3,_1>::MetricRefineQualities
          (MetricRefineQualities<3,_1> *this,Mesh *mesh,LOs *candidates)

{
  int *piVar1;
  Alloc *pAVar2;
  long *local_60 [2];
  long local_50 [2];
  LOs local_40;
  Alloc *local_30;
  
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"metric","");
  Omega_h::Mesh::get_array<double>((Mesh *)this,(Int)mesh,(string *)0x0);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  local_40.write_.shared_alloc_.alloc = (candidates->write_).shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40.write_.shared_alloc_.alloc =
           (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_40.write_.shared_alloc_.alloc)->use_count =
           (local_40.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40.write_.shared_alloc_.direct_ptr = (candidates->write_).shared_alloc_.direct_ptr;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"metric","");
  Omega_h::Mesh::get_array<double>((Mesh *)&stack0xffffffffffffffd0,(Int)mesh,(string *)0x0);
  get_mident_metrics((Omega_h *)(this + 0x10),mesh,1,&local_40,(Reals *)&stack0xffffffffffffffd0,
                     false);
  if (((ulong)local_30 & 7) == 0 && local_30 != (Alloc *)0x0) {
    piVar1 = &local_30->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_30);
      operator_delete(local_30,0x48);
    }
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  pAVar2 = local_40.write_.shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  return;
}

Assistant:

MetricRefineQualities(Mesh* mesh, LOs candidates)
      : vert_metrics(mesh->get_array<Real>(VERT, "metric")),
        /* TODO: we could reuse the results of this instead of recomputing
         * them when transferring an OMEGA_H_METRIC field in transfer.cpp
         */
        midpt_metrics(get_mident_metrics(
            mesh, EDGE, candidates, mesh->get_array<Real>(VERT, "metric"))) {}